

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::read_device
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  element_type *peVar1;
  undefined2 uVar2;
  undefined1 uVar3;
  Compiler *pCVar4;
  bool bVar5;
  char cVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar9;
  long lVar7;
  longlong lVar8;
  Atom *this_00;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  char *p_1;
  Atom local_12c [4];
  Compiler *local_128;
  undefined4 local_120;
  undefined4 local_11c;
  uint16_t *local_118;
  string local_110;
  Ptr local_f0;
  Ptr local_e0;
  Ptr local_d0;
  Ptr local_c0;
  Ptr local_b0;
  Ptr local_a0;
  Ptr local_90;
  longlong local_80;
  Class local_78;
  
  local_11c = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p = (Class *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_118 = extent_index;
  bVar5 = read_nil_did(this,&local_90,write_index,(uint16_t *)p,write);
  uVar9 = extraout_var;
  if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar9 = extraout_var_00;
  }
  local_120 = (undefined4)CONCAT71(uVar9,1);
  if (!bVar5) {
    local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p = (Class *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Class::Class(&local_78,DEVICE_ID);
    local_128 = this;
    bVar5 = read_variable(this,&local_a0,write_index,(uint16_t *)p,write,&local_78);
    std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
              (&local_78.things_to_read);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.str_opcode._M_dataplus._M_p != &local_78.str_opcode.field_2) {
      operator_delete(local_78.str_opcode._M_dataplus._M_p);
    }
    r_code::Atom::~Atom(&local_78.atom);
    if (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pCVar4 = local_128;
    if (!bVar5) {
      local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
      if (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      extent_index_00 = local_118;
      bVar5 = read_reference(local_128,&local_b0,write_index,local_118,write,DEVICE_ID);
      if (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (!bVar5) {
        local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          extent_index_00 = (uint16_t *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar5 = read_wildcard(pCVar4,&local_c0,write_index,extent_index_00,write);
        if (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (!bVar5) {
          local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            extent_index_00 = (uint16_t *)&__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar5 = read_tail_wildcard(pCVar4,&local_d0,write_index,extent_index_00,write);
          if (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (!bVar5) {
            peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"0x","");
            lVar7 = std::__cxx11::string::find
                              ((char *)&peVar1->cmd,(ulong)local_110._M_dataplus._M_p,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if ((lVar7 == 0) &&
               (lVar8 = strtoll((((node->
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->cmd)._M_dataplus._M_p,(char **)&local_110,0x10),
               *local_110._M_dataplus._M_p == '\0')) {
              local_80 = lVar8;
              r_code::Atom::Atom(local_12c,(uint)lVar8);
              cVar6 = r_code::Atom::getDescriptor();
              r_code::Atom::~Atom(local_12c);
              pCVar4 = local_128;
              if (write && cVar6 == -0x5f) {
                r_code::Atom::Atom(local_12c,(uint)local_80);
                this_00 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(pCVar4->current_object + 8),
                                     (ulong)write_index);
                r_code::Atom::operator=(this_00,local_12c);
                r_code::Atom::~Atom(local_12c);
                goto LAB_0012de9f;
              }
              if (cVar6 == -0x5f) goto LAB_0012de9f;
            }
            uVar2 = (local_128->state).pattern_lvl;
            uVar3 = (local_128->state).no_arity_check;
            local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            bVar5 = expression(local_128,&local_e0,DEVICE_ID,write_index,local_118,write);
            if (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            pCVar4 = local_128;
            if (!bVar5) {
              (local_128->state).pattern_lvl = uVar2;
              (local_128->state).no_arity_check = (bool)uVar3;
              if ((char)local_11c != '\0') {
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_110," error: expected a device id","");
                local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
                local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_f0.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_f0.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                set_error(pCVar4,&local_110,&local_f0);
                if (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_f0.
                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p);
                }
              }
              local_120 = 0;
            }
          }
        }
      }
    }
  }
LAB_0012de9f:
  return SUB41(local_120,0);
}

Assistant:

bool Compiler::read_device(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL.
{
    if (read_nil_did(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, DEVICE_ID)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, DEVICE_ID)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (Utils::StartsWith(node->cmd, "0x")) {
        try {
            char *p;
            uintptr_t h = std::strtoll(node->cmd.c_str(), &p, 16);

            if (*p == 0) {
                if (Atom(h).getDescriptor() == Atom::DEVICE) {
                    if (write) {
                        current_object->code[write_index] = Atom(h);
                    }

                    return true;
                }
            }
        } catch (const std::invalid_argument &ia) { }
    }

    State s = save_state();

    if (expression(node, DEVICE_ID, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a device id", node);
        return false;
    }

    return false;
}